

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O3

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
::construct_msgs(suffix_array<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                 *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *param_1,
                vector<unsigned_long,_std::allocator<unsigned_long>_> *param_2,int dist)

{
  comm *comm;
  unsigned_long *puVar1;
  unsigned_long uVar2;
  _func_int **pp_Var3;
  unsigned_long uVar4;
  long lVar5;
  pointer pmVar6;
  pointer pTVar7;
  pointer pTVar8;
  pointer pTVar9;
  pointer pTVar10;
  pointer pTVar11;
  pointer pTVar12;
  size_t sVar13;
  pointer puVar14;
  ostream *poVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  pointer pTVar19;
  pointer ptVar20;
  pointer pmVar21;
  pointer puVar22;
  pointer pmVar23;
  bool bVar24;
  ulong uVar25;
  size_t sVar26;
  ulong *puVar27;
  int iVar28;
  _func_int **pp_Var29;
  pointer pTVar30;
  _func_void *p_Var31;
  MPI_Datatype poVar32;
  ulong uVar33;
  bool bVar34;
  size_t prefix;
  int overlap_type;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> bucket;
  vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> msgs;
  int my_schedule;
  custom_op<unsigned_long,_true> op;
  unsigned_long local_1c0;
  unsigned_long result;
  undefined1 local_1a8 [16];
  MPI_Datatype local_198;
  int left_p;
  vector<unsigned_long,_std::allocator<unsigned_long>_> active_elements;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> local_168;
  vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> out_of_bounds_msgs;
  size_t local_120;
  size_t unresolved_els;
  int result_2;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> local_108;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  minqueries;
  size_t rebucket_offset;
  size_t bucket_offset;
  size_t unfinished_b;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> border_bucket;
  section_timer timer;
  
  comm = &this->comm;
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
  section_timer_impl(&timer,(ostream *)&std::cerr,(this->comm).mpi_comm,0);
  local_1c0 = mxx::left_shift<unsigned_long>
                        ((param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         )._M_impl.super__Vector_impl_data._M_start,comm);
  prefix = (this->part).prefix;
  active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  op._vptr_custom_op = (_func_int **)0x0;
  puVar14 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar22 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_198 = (MPI_Datatype)param_1;
  if (puVar22 != puVar14) {
    do {
      uVar2 = puVar14[(long)op._vptr_custom_op];
      if (((uVar2 != (long)op._vptr_custom_op + prefix + 1) ||
          ((pp_Var29 = (_func_int **)(this->local_size - 1), op._vptr_custom_op < pp_Var29 &&
           (puVar14[(long)op._vptr_custom_op + 1] == uVar2)))) ||
         ((op._vptr_custom_op == pp_Var29 &&
          ((local_1c0 == uVar2 && ((this->comm).m_rank < this->p + -1)))))) {
        if (active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&active_elements,
                     (iterator)
                     active_elements.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish,(unsigned_long *)&op);
          puVar14 = *(pointer *)local_198;
          puVar22 = *(pointer *)(local_198 + 8);
        }
        else {
          *active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish = (unsigned_long)op._vptr_custom_op;
          active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      op._vptr_custom_op = (_func_int **)((long)op._vptr_custom_op + 1);
    } while (op._vptr_custom_op < (_func_int **)((long)puVar22 - (long)puVar14 >> 3));
  }
  op._vptr_custom_op = (_func_int **)((long)&op.m_user_func.super__Function_base._M_functor + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&op,"get active elements","");
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            (&timer,(string *)&op);
  poVar32 = local_198;
  if (op._vptr_custom_op !=
      (_func_int **)((long)&op.m_user_func.super__Function_base._M_functor + 8)) {
    operator_delete(op._vptr_custom_op);
  }
  if ((this->comm).m_rank < this->p + -1) {
    bVar34 = (*(pointer *)(poVar32 + 8))[-1] == local_1c0;
  }
  else {
    bVar34 = false;
  }
  uVar25 = (ulong)dist;
  if (uVar25 < this->n) {
    do {
      puVar14 = active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      out_of_bounds_msgs.
      super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      out_of_bounds_msgs.
      super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      out_of_bounds_msgs.
      super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      unresolved_els = 0;
      unfinished_b = 0;
      for (puVar22 = active_elements.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar22 != puVar14; puVar22 = puVar22 + 1) {
        uVar2 = *puVar22;
        p_Var31 = (_func_void *)(prefix + uVar2);
        op._vptr_custom_op =
             (_func_int **)
             ((this->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar2] + uVar25);
        op.m_user_func.super__Function_base._M_functor._M_unused._M_function_pointer = p_Var31;
        if (op._vptr_custom_op < (_func_int **)this->n) {
          if (msgs.
              super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              msgs.
              super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>::
            _M_realloc_insert<mypair<unsigned_long>>
                      ((vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>> *)&msgs,
                       (iterator)
                       msgs.
                       super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(mypair<unsigned_long> *)&op);
          }
          else {
            (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->first = (unsigned_long)op._vptr_custom_op;
            (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->second = (unsigned_long)p_Var31;
            msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 msgs.
                 super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          op._vptr_custom_op = (_func_int **)0x0;
          if (out_of_bounds_msgs.
              super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              out_of_bounds_msgs.
              super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>::
            _M_realloc_insert<mypair<unsigned_long>>
                      ((vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>> *)
                       &out_of_bounds_msgs,
                       (iterator)
                       out_of_bounds_msgs.
                       super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(mypair<unsigned_long> *)&op);
          }
          else {
            *(undefined4 *)
             &(out_of_bounds_msgs.
               super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->first = 0;
            *(undefined4 *)
             ((long)&(out_of_bounds_msgs.
                      super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->first + 4) = 0;
            (out_of_bounds_msgs.
             super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->second = (unsigned_long)p_Var31;
            out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 out_of_bounds_msgs.
                 super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        unresolved_els = unresolved_els + 1;
        if (*(code **)(*(long *)local_198 + uVar2 * 8) == p_Var31 + 1) {
          unfinished_b = unfinished_b + 1;
        }
      }
      mxx::custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
                ((custom_op<unsigned_long,true> *)&op);
      MPI_Allreduce(&unresolved_els,&result,1,op.m_type_copy,op.m_op,(this->comm).mpi_comm);
      poVar32 = local_198;
      uVar2 = result;
      mxx::custom_op<unsigned_long,_true>::~custom_op(&op);
      mxx::custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
                ((custom_op<unsigned_long,true> *)&op);
      MPI_Allreduce(&unfinished_b,&result,1,op.m_type_copy,op.m_op,(this->comm).mpi_comm);
      mxx::custom_op<unsigned_long,_true>::~custom_op(&op);
      if ((this->comm).m_rank == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"==== chaising iteration ",0x18);
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," unresolved = ",0xe);
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"==== chaising iteration ",0x18);
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," unfinished = ",0xe);
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
      }
      if (uVar2 != 0) {
        mxx::
        all2all_func<mypair<unsigned_long>,suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,true>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&)_1_>
                  (&msgs,(anon_class_8_1_8991fb9c)this,comm);
        if (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          puVar14 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pmVar21 = msgs.
                    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pmVar21->first = puVar14[pmVar21->first - prefix];
            pmVar21 = pmVar21 + 1;
          } while (pmVar21 !=
                   msgs.
                   super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        mxx::
        all2all_func<mypair<unsigned_long>,suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,true>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&)_2_>
                  (&msgs,(anon_class_8_1_8991fb9c)this,comm);
        if (out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<mypair<unsigned_long>*,std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>>>
                    ((vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>> *)&msgs,
                     msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        pmVar23 = msgs.
                  super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pmVar21 = msgs.
                  super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl
          .super__Vector_impl_data._M_finish =
               out_of_bounds_msgs.
               super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        uVar16 = (long)msgs.
                       super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)msgs.
                       super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4;
        if (uVar16 != unresolved_els) {
          __assert_fail("msgs.size() == unresolved_els",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                        ,0x5be,
                        "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, unsigned long, true>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                       );
        }
        if (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          lVar5 = 0x3f;
          if (uVar16 != 0) {
            for (; uVar16 >> lVar5 == 0; lVar5 = lVar5 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<mypair<unsigned_long>*,std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,true>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&,mypair<unsigned_long>const&)_1_>>
                    (msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<mypair<unsigned_long>*,std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,true>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&,mypair<unsigned_long>const&)_1_>>
                    (pmVar21,pmVar23);
        }
        bucket.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        bucket.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bucket.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_168.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_168.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_168.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_108.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        minqueries.
        super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        minqueries.
        super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        minqueries.
        super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        overlap_type = 0;
        lVar5 = **(long **)poVar32;
        local_120 = 0;
        if (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_120 = 0;
          pmVar21 = msgs.
                    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            uVar33 = *(ulong *)(*(long *)poVar32 + (pmVar21->second - prefix) * 8);
            uVar16 = uVar33 - 1;
            if (prefix <= uVar16 && uVar16 != pmVar21->second) {
              __assert_fail("bucket_begin < prefix || bucket_begin == msgit->second",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                            ,0x5dc,
                            "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, unsigned long, true>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                           );
            }
            pmVar23 = msgs.
                      super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pmVar21 !=
                msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              uVar18 = pmVar21->second;
              lVar17 = uVar18 - prefix;
              if (*(ulong *)(*(long *)poVar32 + lVar17 * 8) == uVar33) {
                puVar27 = (ulong *)(*(long *)poVar32 + lVar17 * 8);
                pmVar6 = pmVar21;
                do {
                  pmVar21 = pmVar6 + 1;
                  if ((uVar18 < prefix) || (prefix + this->local_size <= uVar18)) {
                    __assert_fail("msgit->second >= prefix && msgit->second < prefix+local_size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                                  ,0x5e1,
                                  "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, unsigned long, true>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                                 );
                  }
                  op.m_user_func.super__Function_base._M_functor._8_8_ =
                       (this->local_SA).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar17];
                  op._vptr_custom_op = (_func_int **)*puVar27;
                  op.m_user_func.super__Function_base._M_functor._M_unused._0_8_ =
                       (undefined8)pmVar6->first;
                  if (bucket.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish ==
                      bucket.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>::
                    _M_realloc_insert<TwoBSA<unsigned_long>const&>
                              ((vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>
                                *)&bucket,
                               (iterator)
                               bucket.
                               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                               (TwoBSA<unsigned_long> *)&op);
                  }
                  else {
                    (bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->SA =
                         op.m_user_func.super__Function_base._M_functor._8_8_;
                    (bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->B1 =
                         (unsigned_long)op._vptr_custom_op;
                    (bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->B2 =
                         (unsigned_long)
                         op.m_user_func.super__Function_base._M_functor._M_unused._0_8_;
                    bucket.
                    super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         bucket.
                         super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  pmVar23 = pmVar21;
                  if (pmVar21 ==
                      msgs.
                      super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) break;
                  uVar18 = pmVar6[1].second;
                  lVar17 = uVar18 - prefix;
                  puVar27 = (ulong *)(*(long *)poVar32 + lVar17 * 8);
                  pmVar23 = msgs.
                            super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  pmVar6 = pmVar21;
                } while (*puVar27 == uVar33);
              }
            }
            pTVar12 = local_108.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pTVar11 = local_108.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pTVar10 = local_108.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pTVar9 = local_168.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pTVar19 = local_168.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pTVar8 = local_168.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pTVar7 = bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pTVar30 = bucket.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((bool)(pmVar21 == pmVar23 & bVar34)) {
              if ((this->p + -1 <= (this->comm).m_rank) ||
                 ((*(pointer *)(poVar32 + 8))[-1] != local_1c0)) {
                __assert_fail("comm.rank() < p-1 && local_B.back() == right_B",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x5eb,
                              "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, unsigned long, true>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                             );
              }
              if (uVar16 < prefix) {
                local_168.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_168.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_168.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start = pTVar8;
                bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish = pTVar19;
                bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar9;
                overlap_type = 4;
              }
              else {
                overlap_type = overlap_type + 2;
                local_108.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_108.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_108.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start = pTVar10;
                bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish = pTVar11;
                bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar12;
                pTVar19 = pTVar11;
                local_120 = uVar16 - prefix;
              }
            }
            else if (uVar16 < prefix) {
              overlap_type = overlap_type + 1;
              local_168.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   bucket.
                   super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_168.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   bucket.
                   super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_168.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   bucket.
                   super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              bucket.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start = pTVar8;
              bucket.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = pTVar19;
              bucket.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar9;
            }
            else {
              if (bucket.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  bucket.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                uVar18 = ((long)bucket.
                                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)bucket.
                                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555;
                lVar17 = 0x3f;
                if (uVar18 != 0) {
                  for (; uVar18 >> lVar17 == 0; lVar17 = lVar17 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                          (bucket.
                           super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           bucket.
                           super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           ((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
                std::
                __final_insertion_sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (pTVar30,pTVar7);
              }
              poVar32 = local_198;
              sVar26 = uVar16 - prefix;
              if ((sVar26 != 0) && (uVar33 <= *(ulong *)(*(long *)local_198 + -8 + sVar26 * 8))) {
                __assert_fail("out_idx == 0 || local_B[out_idx-1] < cur_b",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x603,
                              "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, unsigned long, true>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                             );
              }
              pTVar19 = bucket.
                        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (bucket.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  bucket.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                pTVar19 = bucket.
                          super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                sVar13 = uVar33 - prefix;
                pTVar30 = bucket.
                          super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  sVar26 = sVar13;
                  sVar13 = prefix;
                  if (pTVar30 !=
                      bucket.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    pp_Var29 = (_func_int **)pTVar30[-1].B2;
                    pp_Var3 = (_func_int **)pTVar30->B2;
                    if (pp_Var29 != pp_Var3) {
                      result = (unsigned_long)pp_Var3;
                      op._vptr_custom_op = pp_Var29;
                      if (pp_Var3 < pp_Var29) {
                        result = (unsigned_long)pp_Var29;
                        op._vptr_custom_op = pp_Var3;
                      }
                      border_bucket.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)((sVar26 - 1) + prefix);
                      std::
                      vector<std::tuple<unsigned_long,unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_long>>>
                      ::emplace_back<unsigned_long,unsigned_long&,unsigned_long&>
                                ((vector<std::tuple<unsigned_long,unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_long>>>
                                  *)&minqueries,(unsigned_long *)&border_bucket,(unsigned_long *)&op
                                 ,&result);
                      uVar33 = sVar13 + sVar26;
                      pTVar19 = bucket.
                                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                    }
                  }
                  (this->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar26 - 1] = pTVar30->SA;
                  *(ulong *)(*(long *)poVar32 + -8 + sVar26 * 8) = uVar33;
                  pTVar30 = pTVar30 + 1;
                  sVar13 = sVar26 + 1;
                } while (pTVar30 != pTVar19);
              }
              if ((sVar26 != this->local_size) &&
                 (*(long *)(*(long *)poVar32 + sVar26 * 8) != prefix + sVar26 + 1)) {
                __assert_fail("out_idx == local_size || local_B[out_idx] == prefix+out_idx+1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x620,
                              "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, unsigned long, true>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                             );
              }
            }
            if (pTVar19 !=
                bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              bucket.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   bucket.
                   super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
            }
          } while (pmVar21 !=
                   msgs.
                   super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        my_schedule = -1;
        if ((this->comm).m_rank == 0) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&op,(long)this->p,
                     (allocator_type *)&result);
          MPI_Gather(&overlap_type,1,&ompi_mpi_int,op._vptr_custom_op,1,&ompi_mpi_int,0,
                     (this->comm).mpi_comm);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&result,(long)this->p,
                     (allocator_type *)&border_bucket);
          if (0 < this->p) {
            lVar17 = 0;
            iVar28 = 0;
            do {
              switch(*(undefined4 *)((long)op._vptr_custom_op + lVar17 * 4)) {
              case 0:
                *(undefined4 *)(result + lVar17 * 4) = 0xffffffff;
                break;
              case 1:
              case 4:
                *(int *)(result + lVar17 * 4) = iVar28;
                break;
              case 2:
                *(undefined4 *)(result + lVar17 * 4) = 0;
                iVar28 = 0;
                break;
              case 3:
                *(int *)(result + lVar17 * 4) = iVar28;
                iVar28 = 1 - iVar28;
                break;
              default:
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x64d,
                              "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, unsigned long, true>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                             );
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < this->p);
          }
          MPI_Scatter(result,1,&ompi_mpi_int,&my_schedule,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
          if (result != 0) {
            operator_delete((void *)result);
          }
          if (op._vptr_custom_op != (_func_int **)0x0) {
            operator_delete(op._vptr_custom_op);
          }
        }
        else {
          MPI_Gather(&overlap_type,1,&ompi_mpi_int,0,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
          MPI_Scatter(0,1,&ompi_mpi_int,&my_schedule,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
        }
        uVar16 = lVar5 - 1;
        iVar28 = 0;
        bVar34 = true;
        do {
          bVar24 = bVar34;
          std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
                    (&border_bucket,&local_168);
          puVar1 = &(this->part).div1mod;
          if (uVar16 < *puVar1) {
            left_p = (int)(uVar16 / ((this->part).div + 1));
          }
          else {
            left_p = (int)((uVar16 - *puVar1) / (this->part).div) + (int)(this->part).mod;
          }
          bucket_offset = 0;
          rebucket_offset = uVar16;
          if (my_schedule == iVar28 || overlap_type != 3) {
            if (overlap_type == 2 && my_schedule == iVar28) goto LAB_00135266;
            bVar34 = overlap_type != 0 && my_schedule == iVar28;
          }
          else {
LAB_00135266:
            std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator=
                      (&border_bucket,&local_108);
            left_p = (this->comm).m_rank;
            bucket_offset = local_120;
            bVar34 = true;
            rebucket_offset = prefix + local_120;
          }
          op._vptr_custom_op = (_func_int **)&left_p;
          op.m_user_func.super__Function_base._M_functor._M_unused._M_object = &border_bucket;
          op.m_user_func.super__Function_base._M_manager = (_Manager_type)&rebucket_offset;
          op.m_user_func._M_invoker = (_Invoker_type)&minqueries;
          op._40_8_ = &bucket_offset;
          result = CONCAT44(result._4_4_,(uint)bVar34);
          op.m_user_func.super__Function_base._M_functor._8_8_ = this;
          op.m_type_copy = poVar32;
          op.m_op = (MPI_Op)&prefix;
          MPI_Allreduce(&result,&result_2,1,&ompi_mpi_int,&ompi_mpi_op_land,(this->comm).mpi_comm);
          if (result_2 == 0) {
            mxx::comm::split((comm *)&result,comm,(uint)bVar34);
            if (bVar34 != false) {
              construct_msgs::anon_class_64_8_0d7252e9::operator()
                        ((anon_class_64_8_0d7252e9 *)&op,(comm *)&result);
            }
            mxx::comm::~comm((comm *)&result);
          }
          else {
            construct_msgs::anon_class_64_8_0d7252e9::operator()
                      ((anon_class_64_8_0d7252e9 *)&op,comm);
          }
          MPI_Barrier((this->comm).mpi_comm);
          if (border_bucket.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(border_bucket.
                            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          iVar28 = 1;
          bVar34 = false;
        } while (bVar24);
        local_1c0 = mxx::left_shift<unsigned_long>(*(unsigned_long **)poVar32,comm);
        if ((this->comm).m_rank < this->p + -1) {
          bVar34 = (*(pointer *)(poVar32 + 8))[-1] == local_1c0;
        }
        else {
          bVar34 = false;
        }
        pmVar21 = msgs.
                  super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pmVar23 = msgs.
                  super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        for (; pmVar23 != pmVar21; pmVar23 = pmVar23 + 1) {
          op._vptr_custom_op = (_func_int **)(pmVar23->second - prefix);
          uVar4 = *(unsigned_long *)(*(long *)poVar32 + (long)op._vptr_custom_op * 8);
          if (((uVar4 != pmVar23->second + 1) ||
              ((pp_Var29 = (_func_int **)(this->local_size - 1), op._vptr_custom_op < pp_Var29 &&
               (*(unsigned_long *)(*(long *)poVar32 + 8 + (long)op._vptr_custom_op * 8) == uVar4))))
             || ((op._vptr_custom_op == pp_Var29 &&
                 ((local_1c0 == uVar4 && ((this->comm).m_rank < this->p + -1)))))) {
            if (active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&active_elements,
                         (iterator)
                         active_elements.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish,(unsigned_long *)&op);
              pmVar21 = msgs.
                        super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              *active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)op._vptr_custom_op;
              active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
        section_timer_impl((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>
                            *)&op,(ostream *)&std::cerr,(this->comm).mpi_comm,0);
        bulk_rmq<unsigned_long>(this->n,&this->local_LCP,&minqueries,comm);
        if (minqueries.
            super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            minqueries.
            super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          puVar14 = (this->local_LCP).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ptVar20 = minqueries.
                    super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            puVar14[(ptVar20->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
                    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl - prefix] =
                 (ptVar20->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
                 super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.
                 super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>.
                 _M_head_impl + uVar25;
            ptVar20 = ptVar20 + 1;
          } while (ptVar20 !=
                   minqueries.
                   super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        result = (unsigned_long)local_1a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&result,"LCP update","");
        mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                  ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)&op
                   ,(string *)&result);
        if ((undefined1 *)result != local_1a8) {
          operator_delete((void *)result);
        }
        mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::depth =
             mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::depth + -1
        ;
        op._vptr_custom_op = (_func_int **)&PTR__section_timer_impl_001509b0;
        if ((MPI_Datatype *)op.m_user_func._M_invoker != &op.m_type_copy) {
          operator_delete(op.m_user_func._M_invoker);
        }
        if (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          puVar14 = (this->local_SA).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar5 = *(long *)poVar32;
          pmVar21 = msgs.
                    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pmVar21->first = puVar14[pmVar21->second - prefix];
            pmVar21->second = *(unsigned_long *)(lVar5 + (pmVar21->second - prefix) * 8);
            pmVar21 = pmVar21 + 1;
          } while (pmVar21 !=
                   msgs.
                   super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        mxx::
        all2all_func<mypair<unsigned_long>,suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,true>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&)_3_>
                  (&msgs,(anon_class_8_1_8991fb9c)this,comm);
        if (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          puVar14 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pmVar21 = msgs.
                    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            puVar14[pmVar21->first - prefix] = pmVar21->second;
            pmVar21 = pmVar21 + 1;
          } while (pmVar21 !=
                   msgs.
                   super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        op._vptr_custom_op =
             (_func_int **)((long)&op.m_user_func.super__Function_base._M_functor + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&op,"bucket-chaising iteration","");
        mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                  (&timer,(string *)&op);
        if (op._vptr_custom_op !=
            (_func_int **)((long)&op.m_user_func.super__Function_base._M_functor + 8)) {
          operator_delete(op._vptr_custom_op);
        }
        if (minqueries.
            super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(minqueries.
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_108.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.
                          super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_168.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_168.
                          super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(bucket.
                          super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(out_of_bounds_msgs.
                        super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(msgs.
                        super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    } while ((uVar2 != 0) && (uVar25 = uVar25 * 2, uVar25 < this->n));
  }
  if (active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(active_elements.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::depth =
       mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::depth + -1;
  timer._vptr_section_timer_impl = (_func_int **)&PTR__section_timer_impl_001509b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)timer.sep._M_dataplus._M_p != &timer.sep.field_2) {
    operator_delete(timer.sep._M_dataplus._M_p);
  }
  return;
}

Assistant:

void construct_msgs(std::vector<index_t>& local_B, std::vector<index_t>& local_ISA, int dist)
{
    /*
     * Algorithm for few remaining buckets (more communication overhead per
     * element but sends only unfinished buckets -> less data in total if few
     * buckets remaining)
     *
     * INPUT:
     *  - SA in SA order
     *  - B in SA order
     *  - ISA in ISA order (<=> B in ISA order)
     *  - dist: the current dist=2^k, gets doubled after every iteration
     *
     * ALGO:
     * 1.) on i:            send tuple (`to:` Sa[i]+2^k, `from:` i)
     * 2.) on SA[i]+2^k:    return tuple (`to:` i, ISA[SA[i]+2^k])
     * 3.) on i:            for each unfinished bucket:
     *                          sort by new bucket index (2-stage across
     *                          processor boundaries using MPI subcommunicators)
     *                          rebucket into `B`
     * 4.) on i:            send tuple (`to:` SA[i], B[i]) // update bucket numbers in ISA order
     * 5.) on SA[i]:        update ISA[SA[i]] to new B[i]
     *
     */

    SAC_TIMER_START();


    /*
     * 0.) Preparation: need unfinished buckets (info accross proc. boundaries)
     */
    // get next element from right
    index_t right_B = mxx::left_shift(local_B[0], comm);

    // get global offset
    const std::size_t prefix = part.excl_prefix_size();

    // get active elements
    std::vector<index_t> active_elements;
    for (std::size_t j = 0; j < local_B.size(); ++j) {
        // get global index for each local index
        std::size_t i =  prefix + j;
        // check if this is a unresolved bucket
        // relying on the property that for resolved buckets:
        //   B[i] == i+1 and B[i+1] == i+2
        //   (where `i' is the global index)
        if (local_B[j] != i+1 || (local_B[j] == i+1
                    && ((j < local_size-1 && local_B[j+1] == i+1)
                        || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
        {
            // save local active indexes
            active_elements.push_back(j);
        }
    }
    SAC_TIMER_END_SECTION("get active elements");

    bool right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

    for (index_t shift_by = dist; shift_by < n; shift_by <<= 1) {
        /*
         * 1.) on i: send tuple (`to:` Sa[i]+2^k, `from:` i)
         */
        //std::vector<std::pair<index_t, index_t> > msgs;
        //std::vector<std::pair<index_t, index_t> > out_of_bounds_msgs;
        std::vector<mypair<index_t> > msgs;
        std::vector<mypair<index_t> > out_of_bounds_msgs;
        // linear scan for bucket boundaries
        // and create tuples/pairs
        std::size_t unresolved_els = 0;
        std::size_t unfinished_b = 0;
        for (index_t j : active_elements) {
            // get global index for each local index
            std::size_t i =  prefix + j;
            // add tuple
            if (local_SA[j] + shift_by >= n)
                //out_of_bounds_msgs.push_back(std::make_pair<index_t,index_t>(0, static_cast<index_t>(i)));
                out_of_bounds_msgs.push_back({0, static_cast<index_t>(i)});
            else
                //msgs.push_back(std::make_pair<index_t,index_t>(local_SA[j]+shift_by, static_cast<index_t>(i)));
                msgs.push_back({local_SA[j]+shift_by, static_cast<index_t>(i)});
            unresolved_els++;
            if (local_B[j] == i+1) // if first element of unfinished bucket:
                unfinished_b++;
        }

        // check if all resolved
        std::size_t gl_unresolved = mxx::allreduce(unresolved_els, comm);
        std::size_t gl_unfinished = mxx::allreduce(unfinished_b, comm);
        if (comm.rank() == 0) {
            INFO("==== chaising iteration " << shift_by << " unresolved = " << gl_unresolved);
            INFO("==== chaising iteration " << shift_by << " unfinished = " << gl_unfinished);
        }
        if (gl_unresolved == 0)
            // finished!
            break;

        // message exchange to processor which contains first index
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.first);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // for each message, add the bucket no. into the `first` field
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_ISA[it->first - prefix];
        }


        /*
         * 2.)
         */
        // send messages back to originator
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.second);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.second);}, comm);

        // append the previous out-of-bounds messages (since they all have B2 = 0)
        if (out_of_bounds_msgs.size() > 0)
            msgs.insert(msgs.end(), out_of_bounds_msgs.begin(), out_of_bounds_msgs.end());
        out_of_bounds_msgs.clear();

        assert(msgs.size() == unresolved_els);

        // sort received messages by the target index to enable consecutive
        // scanning of local buckets and messages
        std::sort(msgs.begin(), msgs.end(), [](const mypair<index_t>& x, const mypair<index_t>& y){ return x.second < y.second;});

        /*
         * 3.)
         */
        // building sequence of triplets for each unfinished bucket and sort
        // then rebucket, buckets which spread accross boundaries, sort via
        // MPI sub communicators and samplesort in two phases
        std::vector<TwoBSA<index_t> > bucket;
        std::vector<TwoBSA<index_t> > left_bucket;
        std::vector<TwoBSA<index_t> > right_bucket;

        // prepare LCP queries vector
        std::vector<std::tuple<index_t, index_t, index_t> > minqueries;

        // find bucket boundaries:
        auto msgit = msgs.begin();
        // overlap type:    0: no overlaps, 1: left overlap, 2:right overlap,
        //                  3: separate overlaps on left and right
        //                  4: contiguous overlap with both sides
        int overlap_type = 0; // init to no overlaps
        std::size_t bucket_begin = local_B[0]-1;
        std::size_t first_bucket_begin = bucket_begin;
        std::size_t right_bucket_offset = 0;
        while (msgit != msgs.end()) {
            bucket_begin = local_B[msgit->second - prefix]-1;
            assert(bucket_begin < prefix || bucket_begin == msgit->second);

            // find end of bucket
            while (msgit != msgs.end() && local_B[msgit->second - prefix]-1 == bucket_begin) {
                TwoBSA<index_t> tuple;
                assert(msgit->second >= prefix && msgit->second < prefix+local_size);
                tuple.SA = local_SA[msgit->second - prefix];
                tuple.B1 = local_B[msgit->second - prefix];
                tuple.B2 = msgit->first;
                bucket.push_back(tuple);
                msgit++;
            }

            // get bucket end (could be on other processor)
            if (msgit == msgs.end() && right_bucket_crosses_proc) {
                assert(comm.rank() < p-1 && local_B.back() == right_B);
                if (bucket_begin >= prefix)
                {
                    overlap_type += 2;
                    right_bucket.swap(bucket);
                    right_bucket_offset = bucket_begin - prefix;
                }
                else
                {
                    // bucket extends to left AND right
                    left_bucket.swap(bucket);
                    overlap_type = 4;
                }
            } else {
                if (bucket_begin >= prefix)
                {
                    // this is a local bucket => sort by B2, rebucket, and save
                    // TODO custom comparison that only sorts by B2, not by B1 as well
                    std::sort(bucket.begin(), bucket.end());
                    // local rebucket
                    // save back into local_B, local_SA, etc
                    index_t cur_b = bucket_begin + 1;
                    std::size_t out_idx = bucket_begin - prefix;
                    // assert previous bucket index is smaller
                    assert(out_idx == 0 || local_B[out_idx-1] < cur_b);
                    for (auto it = bucket.begin(); it != bucket.end(); ++it)
                    {
                        // if this is a new bucket, then update number
                        if (it != bucket.begin() && (it-1)->B2 != it->B2)
                        {
                            // update bucket index
                            cur_b = out_idx + prefix + 1;

                            if (_CONSTRUCT_LCP)
                            {
                                // add as query item for LCP construction
                                index_t left_b  = std::min((it-1)->B2, it->B2);
                                index_t right_b = std::max((it-1)->B2, it->B2);
                                // we need the minumum LCP of all suffixes in buckets between
                                // these two buckets. Since the first element in the left bucket
                                // is the LCP of this bucket with its left bucket and we don't need
                                // this LCP value, start one to the right:
                                // (-1 each since buffer numbers are current index + 1)
                                index_t range_left = (left_b-1) + 1;
                                index_t range_right = (right_b-1) + 1; // +1 since exclusive index
                                minqueries.emplace_back(out_idx + prefix, range_left, range_right);
                            }
                        }
                        local_SA[out_idx] = it->SA;
                        local_B[out_idx] = cur_b;
                        out_idx++;
                    }
                    // assert next bucket index is larger
                    assert(out_idx == local_size || local_B[out_idx] == prefix+out_idx+1);
                }
                else
                {
                    overlap_type += 1;
                    left_bucket.swap(bucket);
                }
            }
            bucket.clear();
        }

        // if we have left/right/both/or double buckets, do global comm in two phases
        int my_schedule = -1;
        if (comm.rank() == 0) {
            // gather all types to first processor
            std::vector<int> overlaps(p);
            MPI_Gather(&overlap_type, 1, MPI_INT, &overlaps[0], 1, MPI_INT, 0, comm);

            // create schedule using linear scan over the overlap types
            std::vector<int> schedule(p);
            int phase = 0; // start in first phase
            for (int i = 0; i < p; ++i) {
                switch (overlaps[i]) {
                    case 0:
                        schedule[i] = -1; // doesn't matter
                        break;
                    case 1:
                        // only left overlap -> participate in current phase
                        schedule[i] = phase;
                        break;
                    case 2:
                        // only right overlap, start with phase 0
                        phase = 0;
                        schedule[i] = phase;
                        break;
                    case 3:
                        // separate overlaps left and right -> switch phase
                        schedule[i] = phase; // left overlap starts with current phase
                        phase = 1 - phase;
                        break;
                    case 4:
                        // overlap with both: left and right => keep phase
                        schedule[i] = phase;
                        break;
                    default:
                        assert(false);
                        break;
                }
            }

            // scatter the schedule to the processors
            MPI_Scatter(&schedule[0], 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        } else {
            // send out my overlap type
            MPI_Gather(&overlap_type, 1, MPI_INT, NULL, 1, MPI_INT, 0, comm);

            // ... let master processor solve the schedule

            // receive schedule:
            MPI_Scatter(NULL, 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        }


        // two phase sorting across boundaries using sub communicators
        for (int phase = 0; phase <= 1; ++phase) {
            std::vector<TwoBSA<index_t> > border_bucket = left_bucket;
            // the leftmost processor of a group will be used as split
            int left_p = part.target_processor(first_bucket_begin);
            bool participate = (overlap_type != 0 && my_schedule == phase);
            std::size_t bucket_offset = 0; // left bucket starts from beginning
            std::size_t rebucket_offset = first_bucket_begin;
            if ((my_schedule != phase && overlap_type == 3) || (my_schedule == phase && overlap_type == 2)) {
                // starting a bucket at the end
                border_bucket = right_bucket;
                left_p = comm.rank();
                participate = true;
                bucket_offset = right_bucket_offset;
                rebucket_offset = prefix + bucket_offset;
            }

            comm.with_subset(participate,[&](const mxx::comm& sc) {
                // split communicator to `left_p`
                mxx::comm subcomm = sc.split(left_p);

                // sample sort the bucket with arbitrary distribution
                mxx::sort(border_bucket.begin(), border_bucket.end(), subcomm);

#ifndef NDEBUG
                index_t first_bucket = border_bucket[0].B1;
#endif
                // rebucket with global offset of first -> in tuple form (also updates LCP)
                rebucket_tuples(border_bucket, subcomm, rebucket_offset, minqueries);
                // assert first bucket index remains the same
                assert(subcomm.rank() != 0 || first_bucket == border_bucket[0].B1);

                // save into full array (if this was left -> save to beginning)
                // (else, need offset of last)
                assert(bucket_offset == 0 || local_B[bucket_offset-1] < border_bucket[0].B1);
                assert(bucket_offset+border_bucket.size() <= local_size);
                for (std::size_t i = 0; i < border_bucket.size(); ++i) {
                    local_SA[i+bucket_offset] = border_bucket[i].SA;
                    local_B[i+bucket_offset] = border_bucket[i].B1;
                }
                assert(bucket_offset+border_bucket.size() == local_size || (local_B[bucket_offset+border_bucket.size()] > local_B[bucket_offset+border_bucket.size()-1]));
                assert(subcomm.rank() != 0 || local_B[bucket_offset] == bucket_offset+prefix+1);

                /*
                 * LCP update
                 */
                // LCP is updated in the custom `rebucket_tuples` function
            });

            comm.barrier();
        }


        // get new bucket number to the right
        right_B = mxx::left_shift(local_B[0], comm);
        // check if right bucket still goes over boundary
        right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

        // remember all the remaining active elements
        active_elements.clear();
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            index_t j = it->second - prefix;
            index_t i = it->second;
            // check if this is a unresolved bucket
            // relying on the property that for resolved buckets:
            //   B[i] == i+1 and B[i+1] == i+2
            //   (where `i' is the global index)
            if (local_B[j] != i+1 || (local_B[j] == i+1
                        && ((j < local_size-1 && local_B[j+1] == i+1)
                            || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
            {
                // save local active indexes
                active_elements.push_back(j);
            }
        }

        /*
         * 4.1)   Update LCP
         */
        if (_CONSTRUCT_LCP) {
            // time LCP separately!
            SAC_TIMER_START();
            // get parallel-distributed RMQ for all queries, results are in
            // `minqueries`
            // TODO: bulk updatable RMQs [such that we don't have to construct the
            //       RMQ for the local_LCP in each iteration]
            bulk_rmq(n, local_LCP, minqueries, comm);

            // update the new LCP values:
            for (auto min_lcp : minqueries) {
                local_LCP[std::get<0>(min_lcp) - prefix] = shift_by + std::get<2>(min_lcp);
            }
            SAC_TIMER_END_SECTION("LCP update");
        }

        /*
         * 4.2)  Update ISA
         */
        // message new bucket numbers to new SA[i] for all previously unfinished
        // buckets
        // since the message array is still available with the indices of unfinished
        // buckets -> reuse that information => no need to rescan the whole
        // local array
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_SA[it->second - prefix]; // SA[i]
            it->second = local_B[it->second - prefix]; // B[i]
        }

        // message exchange to processor which contains first index
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // update local ISA with new bucket numbers
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            local_ISA[it->first-prefix] = it->second;
        }
        SAC_TIMER_END_SECTION("bucket-chaising iteration");
    }
}